

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::CalcStats(SM_Manager *this,char *relName)

{
  int iVar1;
  Attr *pAVar2;
  RC RVar3;
  ostream *poVar4;
  size_t sVar5;
  char *pcVar6;
  reference pvVar7;
  size_type sVar8;
  long lVar9;
  int local_254;
  int slot;
  int i_3;
  AttrCatEntry *aEntry;
  RM_Record attrRec;
  SM_AttrIterator attrIt;
  float attrValue;
  allocator<char> local_1a9;
  undefined1 local_1a8 [8];
  string attr;
  int offset;
  int i_2;
  char *recData;
  RM_Record rec;
  RM_FileHandle fh;
  RM_FileScan fs;
  int i_1;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  numDistinct;
  IX_IndexHandle local_65;
  int local_64;
  IX_IndexHandle ih;
  Attr *pAStack_60;
  int i;
  Attr *attributes;
  RelCatEntry *local_48;
  RelCatEntry *relEntry;
  RM_Record relRec;
  RC rc;
  char *relName_local;
  SM_Manager *this_local;
  
  relRec._20_4_ = 0;
  poVar4 = std::operator<<((ostream *)&std::cout,"Calculating stats for relation ");
  poVar4 = std::operator<<(poVar4,relName);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  sVar5 = strlen(relName);
  if (sVar5 < 0x19) {
    RM_Record::RM_Record((RM_Record *)&relEntry);
    relRec._20_4_ = GetRelEntry(this,relName,(RM_Record *)&relEntry,&local_48);
    this_local._4_4_ = relRec._20_4_;
    if (relRec._20_4_ == 0) {
      pAStack_60 = (Attr *)malloc((long)local_48->attrCount * 0x30);
      for (local_64 = 0; local_64 < local_48->attrCount; local_64 = local_64 + 1) {
        lVar9 = (long)local_64;
        pAVar2 = pAStack_60 + lVar9;
        pAVar2->numDistinct = 0;
        pAVar2->maxValue = 0.0;
        *(undefined8 *)(&pAVar2->numDistinct + 2) = 0;
        *(undefined8 *)&pAStack_60[lVar9].ih = 0;
        *(_func_bool_char_ptr_string_int **)(&pAStack_60[lVar9].ih + 8) =
             (_func_bool_char_ptr_string_int *)0x0;
        pAVar2 = pAStack_60 + lVar9;
        pAVar2->offset = 0;
        pAVar2->type = 0;
        pAVar2->length = 0;
        pAVar2->indexNo = 0;
        IX_IndexHandle::IX_IndexHandle(&local_65);
        numDistinct.
        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        numDistinct.
        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        memcpy(pAStack_60 + local_64,
               &numDistinct.
                super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0x2c);
        Attr::~Attr((Attr *)&numDistinct.
                             super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        IX_IndexHandle::~IX_IndexHandle(&local_65);
      }
      relRec._20_4_ = PrepareAttr(this,local_48,pAStack_60);
      this_local._4_4_ = relRec._20_4_;
      if (relRec._20_4_ == 0) {
        iVar1 = local_48->attrCount;
        std::
        allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::allocator((allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&fs.field_0x5f);
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&i_1,(long)iVar1,(allocator_type *)&fs.field_0x5f);
        std::
        allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~allocator((allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&fs.field_0x5f);
        fs.useNextPage = false;
        fs.hasPagePinned = false;
        fs.initializedValue = false;
        fs._91_1_ = 0;
        for (; (int)fs._88_4_ < local_48->attrCount; fs._88_4_ = fs._88_4_ + 1) {
          pAStack_60[(int)fs._88_4_].numDistinct = 0;
          pAStack_60[(int)fs._88_4_].maxValue = 1.1754944e-38;
          pAStack_60[(int)fs._88_4_].minValue = 3.4028235e+38;
        }
        local_48->numTuples = 0;
        local_48->statsInitialized = true;
        RM_FileScan::RM_FileScan((RM_FileScan *)&fh.header_modified);
        RM_FileHandle::RM_FileHandle((RM_FileHandle *)&rec.size);
        RM_Record::RM_Record((RM_Record *)&recData);
        relRec._20_4_ = RM_Manager::OpenFile(this->rmm,relName,(RM_FileHandle *)&rec.size);
        if ((relRec._20_4_ == 0) &&
           (relRec._20_4_ =
                 RM_FileScan::OpenScan
                           ((RM_FileScan *)&fh.header_modified,(RM_FileHandle *)&rec.size,INT,0,0,
                            NO_OP,(void *)0x0,NO_HINT), relRec._20_4_ == 0)) {
          relRec._20_4_ = 0;
          while (RVar3 = RM_FileScan::GetNextRec
                                   ((RM_FileScan *)&fh.header_modified,(RM_Record *)&recData),
                RVar3 != 0x6e) {
            relRec._20_4_ = RM_Record::GetData((RM_Record *)&recData,(char **)&offset);
            this_local._4_4_ = relRec._20_4_;
            if (relRec._20_4_ != 0) goto LAB_0010f985;
            relRec._20_4_ = 0;
            for (attr.field_2._12_4_ = 0; (int)attr.field_2._12_4_ < local_48->attrCount;
                attr.field_2._12_4_ = attr.field_2._12_4_ + 1) {
              attr.field_2._8_4_ = pAStack_60[(int)attr.field_2._12_4_].offset;
              pcVar6 = _offset + (int)attr.field_2._8_4_;
              iVar1 = pAStack_60[(int)attr.field_2._12_4_].length;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<char*,void>
                        ((string *)local_1a8,pcVar6,pcVar6 + iVar1,&local_1a9);
              std::allocator<char>::~allocator(&local_1a9);
              pvVar7 = std::
                       vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&i_1,(long)(int)attr.field_2._12_4_);
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(pvVar7,(value_type *)local_1a8);
              if (pAStack_60[(int)attr.field_2._12_4_].type == 2) {
                attrIt.fs._92_4_ = ConvertStrToFloat(this,_offset + (int)attr.field_2._8_4_);
              }
              else if (pAStack_60[(int)attr.field_2._12_4_].type == 0) {
                attrIt.fs._92_4_ = (BADTYPE)*(int *)(_offset + (int)attr.field_2._8_4_);
              }
              else {
                pcVar6 = _offset + (int)attr.field_2._8_4_;
                attrIt.fs._92_1_ = pcVar6[0];
                attrIt.fs._93_1_ = pcVar6[1];
                attrIt.fs._94_1_ = pcVar6[2];
                attrIt.fs._95_1_ = pcVar6[3];
              }
              if (pAStack_60[(int)attr.field_2._12_4_].maxValue <= (float)attrIt.fs._92_4_ &&
                  (float)attrIt.fs._92_4_ != pAStack_60[(int)attr.field_2._12_4_].maxValue) {
                pAStack_60[(int)attr.field_2._12_4_].maxValue = (float)attrIt.fs._92_4_;
              }
              if ((float)attrIt.fs._92_4_ < pAStack_60[(int)attr.field_2._12_4_].minValue) {
                pAStack_60[(int)attr.field_2._12_4_].minValue = (float)attrIt.fs._92_4_;
              }
              std::__cxx11::string::~string((string *)local_1a8);
            }
            local_48->numTuples = local_48->numTuples + 1;
          }
          relRec._20_4_ = RM_FileHandle::UpdateRec(&this->relcatFH,(RM_Record *)&relEntry);
          if ((relRec._20_4_ == 0) &&
             (relRec._20_4_ = RM_FileHandle::ForcePages(&this->relcatFH,-1), relRec._20_4_ == 0)) {
            SM_AttrIterator::SM_AttrIterator((SM_AttrIterator *)&attrRec.size);
            relRec._20_4_ =
                 SM_AttrIterator::OpenIterator
                           ((SM_AttrIterator *)&attrRec.size,&this->attrcatFH,local_48->relName);
            this_local._4_4_ = relRec._20_4_;
            if (relRec._20_4_ == 0) {
              RM_Record::RM_Record((RM_Record *)&aEntry);
              for (local_254 = 0; local_254 < local_48->attrCount; local_254 = local_254 + 1) {
                relRec._20_4_ =
                     SM_AttrIterator::GetNextAttr
                               ((SM_AttrIterator *)&attrRec.size,(RM_Record *)&aEntry,
                                (AttrCatEntry **)&slot);
                this_local._4_4_ = relRec._20_4_;
                if (relRec._20_4_ != 0) goto LAB_0010f95d;
                iVar1 = _slot->attrNum;
                _slot->minValue = pAStack_60[iVar1].minValue;
                _slot->maxValue = pAStack_60[iVar1].maxValue;
                pvVar7 = std::
                         vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[]((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&i_1,(long)iVar1);
                sVar8 = std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(pvVar7);
                _slot->numDistinct = (int)sVar8;
                relRec._20_4_ = RM_FileHandle::UpdateRec(&this->attrcatFH,(RM_Record *)&aEntry);
                this_local._4_4_ = relRec._20_4_;
                if (relRec._20_4_ != 0) goto LAB_0010f95d;
                relRec._20_4_ = 0;
              }
              relRec._20_4_ = SM_AttrIterator::CloseIterator((SM_AttrIterator *)&attrRec.size);
              this_local._4_4_ = relRec._20_4_;
              if ((relRec._20_4_ == 0) &&
                 (relRec._20_4_ = RM_FileHandle::ForcePages(&this->attrcatFH,-1),
                 this_local._4_4_ = relRec._20_4_, relRec._20_4_ == 0)) {
                this_local._4_4_ = 0;
              }
LAB_0010f95d:
              RM_Record::~RM_Record((RM_Record *)&aEntry);
            }
            SM_AttrIterator::~SM_AttrIterator((SM_AttrIterator *)&attrRec.size);
          }
          else {
            this_local._4_4_ = relRec._20_4_;
          }
        }
        else {
          this_local._4_4_ = relRec._20_4_;
        }
LAB_0010f985:
        RM_Record::~RM_Record((RM_Record *)&recData);
        RM_FileHandle::~RM_FileHandle((RM_FileHandle *)&rec.size);
        RM_FileScan::~RM_FileScan((RM_FileScan *)&fh.header_modified);
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&i_1);
      }
    }
    RM_Record::~RM_Record((RM_Record *)&relEntry);
  }
  else {
    this_local._4_4_ = 0x12e;
  }
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::CalcStats(const char *relName){
  RC rc = 0;
  cout << "Calculating stats for relation " << relName << endl;
  if(strlen(relName) > MAXNAME) // check for whether this is a valid name
    return (SM_BADRELNAME);

  // Retrieve the record associated with the relation
  RM_Record relRec;
  RelCatEntry *relEntry;
  if((rc = GetRelEntry(relName, relRec, relEntry)))
    return (rc);

  // Creates a struct containing info about the attributes to 
  // help with loading
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    memset((void*)&attributes[i], 0, sizeof(attributes[i]));
    IX_IndexHandle ih;
    attributes[i] = (Attr) {0, 0, 0, 0, ih, recInsert_string, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = PrepareAttr(relEntry, attributes)))
    return (rc);

  vector<set<string> > numDistinct(relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    attributes[i].numDistinct = 0;
    attributes[i].maxValue = FLT_MIN;
    attributes[i].minValue = FLT_MAX;
  }
  relEntry->numTuples = 0;
  relEntry->statsInitialized = true;

  // Open the relation and iterate through it
  RM_FileScan fs;
  RM_FileHandle fh;
  RM_Record rec;
  if((rc = rmm.OpenFile(relName, fh)) || (rc = fs.OpenScan(fh, INT, 0, 0, NO_OP, NULL)))
    return (rc);
  while(RM_EOF != fs.GetNextRec(rec)){
    char * recData;
    if((rc = rec.GetData(recData)))
      return (rc);

    for(int i = 0;  i < relEntry->attrCount; i++){
      int offset = attributes[i].offset;
      string attr(recData + offset, recData + offset + attributes[i].length);
      numDistinct[i].insert(attr);
      float attrValue = 0.0;
      if(attributes[i].type == STRING)
        attrValue = ConvertStrToFloat(recData + offset);
      else if(attributes[i].type == INT)
        attrValue = (float) *((int*) (recData + offset));
      else
        attrValue = *((float*)(recData + offset));
      if(attrValue > attributes[i].maxValue)
        attributes[i].maxValue = attrValue;
      if(attrValue < attributes[i].minValue)
        attributes[i].minValue = attrValue;
    }
    relEntry->numTuples++;

  }

  // write everything back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = relcatFH.ForcePages()))
    return (rc);

  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, relEntry->relName)))
    return (rc);
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  for(int i = 0; i < relEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry)))
      return (rc);
    // For each attribute, place its information in the appropriate slot
    int slot = aEntry->attrNum;
    aEntry->minValue = attributes[slot].minValue;
    aEntry->maxValue = attributes[slot].maxValue;
    aEntry->numDistinct = numDistinct[slot].size();
    if((rc = attrcatFH.UpdateRec(attrRec)))
      return (rc);
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);
  if((rc = attrcatFH.ForcePages()))
    return (rc);


  return (0);
}